

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O2

map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
* picobench::report::get_problem_space_view
            (map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
             *__return_storage_ptr__,suite *s)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pbVar3;
  mapped_type *this;
  benchmark *bm;
  pointer pbVar4;
  benchmark_problem_space *d;
  pointer __k;
  problem_space_benchmark local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar2 = (s->benchmarks).
           super__Vector_base<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (s->benchmarks).
                super__Vector_base<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1) {
    pbVar3 = (pbVar4->data).
             super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (pbVar4->data).
               super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
               ._M_impl.super__Vector_impl_data._M_start; __k != pbVar3; __k = __k + 1) {
      this = std::
             map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
             ::operator[](__return_storage_ptr__,&__k->dimension);
      local_50.name = pbVar4->name;
      local_50.is_baseline = pbVar4->is_baseline;
      local_50.total_time_ns = __k->total_time_ns;
      local_50.result = __k->result;
      std::
      vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
      ::emplace_back<picobench::report::problem_space_benchmark>(this,&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::map<int, std::vector<problem_space_benchmark>> get_problem_space_view(const suite& s)
    {
        std::map<int, std::vector<problem_space_benchmark>> res;
        for (auto& bm : s.benchmarks)
        {
            for (auto& d : bm.data)
            {
                auto& pvbs = res[d.dimension];
                pvbs.push_back({ bm.name, bm.is_baseline, d.total_time_ns, d.result });
            }
        }
        return res;
    }